

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall LiteScript::CreateVariable(LiteScript *this,Memory *memory,int value)

{
  Object *this_00;
  Number *this_01;
  uint *extraout_RDX;
  Variable VVar1;
  Number local_28;
  undefined1 local_1d;
  int local_1c;
  Memory *pMStack_18;
  int value_local;
  Memory *memory_local;
  Variable *v;
  
  local_1d = 0;
  local_1c = value;
  pMStack_18 = memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  Number::Number(&local_28,local_1c);
  this_00 = Variable::operator->((Variable *)this);
  this_01 = Object::GetData<LiteScript::Number>(this_00);
  Number::operator=(this_01,&local_28);
  VVar1.nb_ref = extraout_RDX;
  VVar1.obj = (Object *)this;
  return VVar1;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int value) {
    Variable v = memory.Create(Type::NUMBER);
    v->GetData<Number>() = Number(value);
    return v;
}